

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O3

lua_State * lj_state_new(lua_State *L)

{
  TValue *__s;
  lua_State *plVar1;
  ulong *puVar2;
  
  plVar1 = (lua_State *)lj_mem_newgco(L,0x60);
  plVar1->gct = '\x06';
  plVar1->dummy_ffid = '\x01';
  plVar1->status = '\0';
  plVar1->stacksize = 0;
  plVar1->cframe = (void *)0x0;
  (plVar1->stack).ptr64 = 0;
  (plVar1->openupval).gcptr64 = 0;
  (plVar1->glref).ptr64 = (L->glref).ptr64;
  (plVar1->env).gcptr64 = (L->env).gcptr64;
  puVar2 = (ulong *)lj_mem_realloc(L,(void *)0x0,0,0x180);
  (plVar1->stack).ptr64 = (uint64_t)puVar2;
  plVar1->stacksize = 0x30;
  (plVar1->maxstack).ptr64 = (uint64_t)(puVar2 + 0x27);
  *puVar2 = (ulong)plVar1 | 0xfffc800000000000;
  puVar2[1] = 0xffffffffffffffff;
  __s = (TValue *)(puVar2 + 2);
  plVar1->top = __s;
  plVar1->base = __s;
  memset(__s,0xff,0x170);
  return plVar1;
}

Assistant:

lua_State *lj_state_new(lua_State *L)
{
  lua_State *L1 = lj_mem_newobj(L, lua_State);
  L1->gct = ~LJ_TTHREAD;
  L1->dummy_ffid = FF_C;
  L1->status = LUA_OK;
  L1->stacksize = 0;
  setmref(L1->stack, NULL);
  L1->cframe = NULL;
  /* NOBARRIER: The lua_State is new (marked white). */
  setgcrefnull(L1->openupval);
  setmrefr(L1->glref, L->glref);
  setgcrefr(L1->env, L->env);
  stack_init(L1, L);  /* init stack */
  lj_assertL(iswhite(obj2gco(L1)), "new thread object is not white");
  return L1;
}